

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMateGeneric::IntToDescriptor
          (ChLinkMateGeneric *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  pointer ppCVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  ChConstraintTwoBodies *pCVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  
  lVar7 = (long)(this->mask).nconstr;
  if (0 < lVar7) {
    ppCVar1 = (this->mask).constraints.
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar3 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    pdVar4 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar5 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    lVar9 = 0;
    iVar8 = 0;
    do {
      if ((this->mask).nconstr <= lVar9) {
LAB_005b34ac:
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      pCVar6 = ppCVar1[lVar9];
      if ((pCVar6->super_ChConstraintTwo).super_ChConstraint.active == true) {
        uVar10 = (ulong)(iVar8 + off_L);
        if (lVar3 <= (long)uVar10) {
LAB_005b34cb:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        (pCVar6->super_ChConstraintTwo).super_ChConstraint.l_i = pdVar2[uVar10];
        if ((this->mask).nconstr <= lVar9) goto LAB_005b34ac;
        if (lVar5 <= (long)uVar10) goto LAB_005b34cb;
        (pCVar6->super_ChConstraintTwo).super_ChConstraint.b_i = pdVar4[uVar10];
        iVar8 = iVar8 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntToDescriptor(const unsigned int off_v,
                                        const ChStateDelta& v,
                                        const ChVectorDynamic<>& R,
                                        const unsigned int off_L,
                                        const ChVectorDynamic<>& L,
                                        const ChVectorDynamic<>& Qc) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            mask.Constr_N(i).Set_l_i(L(off_L + cnt));
            mask.Constr_N(i).Set_b_i(Qc(off_L + cnt));
            cnt++;
        }
    }
}